

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O2

int printS(Sudoku *s,int u,int v)

{
  ostream *poVar1;
  char *pcVar2;
  int x;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  int iVar7;
  bool bVar8;
  
  uVar6 = 0;
  do {
    if (uVar6 == 9) {
      poVar1 = std::operator<<((ostream *)&std::cout,"+--+--+--|--+--+--|--+--+--+");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout," ");
      for (iVar7 = 0; iVar7 < u * 3; iVar7 = iVar7 + 3) {
        std::operator<<((ostream *)&std::cout,"   ");
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"^");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"w,s,a,d = pohyb v mrizce");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"1-9     = zapsani cisla");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"x,0     = smazani cisla");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"exit    = ukonceni programu");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "solve   = vyreseni sudoku z aktualniho stavu - pri spatnem vyplneni nefunguje"
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"rsolve  = vyreseni sudoku z vychoziho stavu");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"print   = vypise aktualni stav");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      return (int)poVar1;
    }
    pcVar4 = "+--+--+--|--+--+--|--+--+--+";
    if (uVar6 == 3) {
      pcVar4 = "---------+--------+---------";
    }
    if (uVar6 == 6) {
      pcVar4 = "---------+--------+---------";
    }
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar5 = uVar6 ^ (uint)v;
    for (uVar3 = 0; uVar3 != 9; uVar3 = uVar3 + 1) {
      if (((uint)*(sudoku_policko *)((long)s + uVar3 * 4) & 0xf) == 0) {
        bVar8 = (uint)u == uVar3 && uVar5 == 0;
        pcVar4 = "|. ";
        pcVar2 = "|O<";
LAB_00104753:
        if (bVar8) {
          pcVar4 = pcVar2;
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"|");
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        pcVar4 = " ";
        if (((uint)*(sudoku_policko *)((long)s + uVar3 * 4) & 0x10) != 0) {
          bVar8 = (uint)u == uVar3 && uVar5 == 0;
          pcVar4 = ".";
          pcVar2 = "X";
          goto LAB_00104753;
        }
      }
      std::operator<<((ostream *)&std::cout,pcVar4);
    }
    std::operator<<((ostream *)&std::cout,"|");
    if (uVar6 == (uint)v) {
      std::operator<<((ostream *)&std::cout,"<--");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar6 = uVar6 + 1;
    s = (Sudoku *)((long)s + 0x24);
  } while( true );
}

Assistant:

int printS ( Sudoku * s, int u, int v )
{
  for(int y=0;y<9;y++) // projdeme radky
  {
    // formatovani car podle toho, ktery radek se zpracovava
    if(y == 3 || y == 6)
    {
      cout << "---------+--------+---------" << endl;
    }
    else
    {
      cout << "+--+--+--|--+--+--|--+--+--+" << endl;
    }
    for(int x=0;x<9;x++)// projdeme bunky v radku
    {
      if (s->s.pole[y*9+x].zapsane) // je tam neco?
      {
        cout << "|";
        cout<< s->s.pole[y*9+x].zapsane; // vypiseme
        if(s->s.pole[y*9+x].pevne) // pridame za to x, pkud je to pevna hodnota
        {
          if(u == x && v == y)
            cout << "X";
          else cout << ".";
        }
        else cout << " ";
      }
      else
      {
        if(u == x && v == y)
          cout<< "|O<";
        else
          cout<< "|. ";
      }
    } 
    cout << "|";
    if(v == y) cout << "<--"; // kresleni ukazatele polohy
    cout << endl;
  }
  cout << "+--+--+--|--+--+--|--+--+--+" << endl;
  cout << " ";
  // kresleni ukazatele polohy
  for (int i = 0;i< u*3; i+=3)
  {
    cout << "   ";
  }
  cout << "^" << endl;
}